

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O0

unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
 __thiscall
HawkTracer::parser::
make_unique<HawkTracer::parser::EventKlassField,char_const(&)[17],char_const(&)[12],HawkTracer::parser::FieldTypeId>
          (parser *this,char (*args) [17],char (*args_1) [12],FieldTypeId *args_2)

{
  FieldTypeId type_id;
  FieldTypeId *pFVar1;
  char (*pacVar2) [12];
  EventKlassField *this_00;
  shared_ptr<const_HawkTracer::parser::EventKlass> local_98;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  FieldTypeId *local_28;
  FieldTypeId *args_local_2;
  char (*args_local_1) [12];
  char (*args_local) [17];
  
  local_28 = args_2;
  args_local_2 = (FieldTypeId *)args_1;
  args_local_1 = (char (*) [12])args;
  args_local = (char (*) [17])this;
  this_00 = (EventKlassField *)operator_new(0x58);
  pacVar2 = args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,*pacVar2,&local_49);
  pFVar1 = args_local_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,(char *)pFVar1,&local_81);
  type_id = *local_28;
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::shared_ptr(&local_98,(nullptr_t)0x0);
  EventKlassField::EventKlassField(this_00,(string *)local_48,(string *)local_80,type_id,&local_98);
  std::
  unique_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>>
  ::unique_ptr<std::default_delete<HawkTracer::parser::EventKlassField>,void>
            ((unique_ptr<HawkTracer::parser::EventKlassField,std::default_delete<HawkTracer::parser::EventKlassField>>
              *)this,this_00);
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr(&local_98);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}